

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O3

xml_node __thiscall
NULLCPugiXML::xml_node__first_element_by_path
          (NULLCPugiXML *this,NULLCArray path,char delimiter,xml_node *ptr)

{
  undefined7 in_register_00000009;
  xml_node local_20;
  
  if (this == (NULLCPugiXML *)0x0) {
    nullcThrowError("path is empty",path.ptr);
    local_20._root = (xml_node_struct *)0x0;
    pugi::xml_node::xml_node(&local_20);
  }
  else {
    pugi::xml_node::xml_node(&local_20);
    local_20 = pugi::xml_node::first_element_by_path
                         ((xml_node *)CONCAT71(in_register_00000009,delimiter),(char_t *)this,
                          (char_t)path.len);
  }
  return (xml_node)local_20._root;
}

Assistant:

xml_node xml_node__first_element_by_path(NULLCArray path, char delimiter, xml_node* ptr)
	{
		if(!path.ptr)
		{
			nullcThrowError("path is empty");
			return xml_node();
		}
		xml_node ret;
		ret.node = ptr->node.first_element_by_path(path.ptr, delimiter);
		return ret;
	}